

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O1

int __thiscall FIX::DateTime::getWeekDay(DateTime *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int D;
  int M;
  int Y;
  int local_24;
  int local_20;
  int local_1c;
  
  getYMD(this->m_date,&local_1c,&local_20,&local_24);
  iVar1 = local_20 + 10;
  if (2 < local_20) {
    iVar1 = local_20 + -2;
  }
  local_1c = local_1c - (uint)(local_20 < 3);
  iVar4 = local_1c % 100;
  iVar3 = (int)((ulong)((long)local_1c * -0x51eb851f) >> 0x20);
  iVar2 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  iVar1 = iVar4 + local_24 + local_1c / 400 + (iVar2 >> 2) + ((iVar3 >> 5) - (iVar3 >> 0x1f)) * 2 +
          (int)((double)iVar1 * 2.6 + -0.2);
  iVar2 = iVar1 % 7;
  iVar1 = iVar1 % 7 + 7;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1 + 1;
}

Assistant:

inline void getYMD(int &year, int &month, int &day) const { getYMD(m_date, year, month, day); }